

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool __thiscall
httplib::ClientImpl::process_request
          (ClientImpl *this,Stream *strm,Request *req,Response *res,bool close_connection,
          Error *error)

{
  bool bVar1;
  _Any_data local_a0;
  undefined8 local_90;
  undefined8 uStack_88;
  int dummy_status;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  bVar1 = write_request(this,strm,req,close_connection,error);
  if (!bVar1) {
    return false;
  }
  bVar1 = read_response_line(this,strm,req,res);
  if ((!bVar1) || (bVar1 = detail::read_headers(strm,&res->headers), !bVar1)) {
    *error = Read;
    return false;
  }
  if (((req->response_handler_).super__Function_base._M_manager != (_Manager_type)0x0) &&
     (bVar1 = std::function<bool_(const_httplib::Response_&)>::operator()
                        (&req->response_handler_,res), !bVar1)) {
    *error = Canceled;
    return false;
  }
  if (((res->status != 0xcc) && (bVar1 = std::operator!=(&req->method,"HEAD"), bVar1)) &&
     (bVar1 = std::operator!=(&req->method,"CONNECT"), bVar1)) {
    if ((req->content_receiver_).super__Function_base._M_manager == (_Manager_type)0x0) {
      local_68 = std::
                 _Function_handler<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/junaidrahim[P]locate-route/src/../include/httplib.h:5708:8)>
                 ::_M_manager;
      local_60 = std::
                 _Function_handler<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/junaidrahim[P]locate-route/src/../include/httplib.h:5708:8)>
                 ::_M_invoke;
      local_a0._8_8_ = (Error *)0x0;
      local_a0._M_unused._M_object = res;
    }
    else {
      local_68 = std::
                 _Function_handler<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/junaidrahim[P]locate-route/src/../include/httplib.h:5702:8)>
                 ::_M_manager;
      local_60 = std::
                 _Function_handler<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/junaidrahim[P]locate-route/src/../include/httplib.h:5702:8)>
                 ::_M_invoke;
      local_a0._8_8_ = error;
      local_a0._M_unused._M_object = req;
    }
    local_38 = std::
               _Function_handler<bool_(unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/junaidrahim[P]locate-route/src/../include/httplib.h:5717:20)>
               ::_M_invoke;
    local_40 = std::
               _Function_handler<bool_(unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/junaidrahim[P]locate-route/src/../include/httplib.h:5717:20)>
               ::_M_manager;
    local_90 = 0;
    uStack_88 = 0;
    local_78._M_unused._M_object = local_a0._M_unused._M_object;
    local_78._8_8_ = local_a0._8_8_;
    local_50._M_unused._M_object = req;
    local_50._8_8_ = error;
    bVar1 = detail::read_content<httplib::Response>
                      (strm,res,0xffffffffffffffff,&dummy_status,(Progress *)&local_50,
                       (ContentReceiverWithProgress *)&local_78,this->decompress_);
    std::_Function_base::~_Function_base((_Function_base *)&local_78);
    std::_Function_base::~_Function_base((_Function_base *)&local_50);
    if (*error != Canceled && !bVar1) {
      *error = Read;
    }
    std::_Function_base::~_Function_base((_Function_base *)&local_a0);
    if (!bVar1) {
      return false;
    }
  }
  Response::get_header_value_abi_cxx11_((string *)&local_a0,res,"Connection",0);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_a0,"close");
  if (bVar1) {
    std::__cxx11::string::~string((string *)local_a0._M_pod_data);
  }
  else {
    bVar1 = std::operator==(&res->version,"HTTP/1.0");
    if (!bVar1) {
      std::__cxx11::string::~string((string *)local_a0._M_pod_data);
      goto LAB_0010db27;
    }
    bVar1 = std::operator!=(&res->reason,"Connection established");
    std::__cxx11::string::~string((string *)local_a0._M_pod_data);
    if (!bVar1) goto LAB_0010db27;
  }
  lock_socket_and_shutdown_and_close(this);
LAB_0010db27:
  if ((this->logger_).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::function<void_(const_httplib::Request_&,_const_httplib::Response_&)>::operator()
              (&this->logger_,req,res);
    return true;
  }
  return true;
}

Assistant:

inline bool ClientImpl::process_request(Stream &strm, const Request &req,
											Response &res, bool close_connection,
											Error &error) {
		// Send request
		if (!write_request(strm, req, close_connection, error)) { return false; }

		// Receive response and headers
		if (!read_response_line(strm, req, res) ||
			!detail::read_headers(strm, res.headers)) {
			error = Error::Read;
			return false;
		}

		if (req.response_handler_) {
			if (!req.response_handler_(res)) {
				error = Error::Canceled;
				return false;
			}
		}

		// Body
		if ((res.status != 204) && req.method != "HEAD" && req.method != "CONNECT") {
			auto out =
					req.content_receiver_
					? static_cast<ContentReceiverWithProgress>(
							[&](const char *buf, size_t n, uint64_t off, uint64_t len) {
								auto ret = req.content_receiver_(buf, n, off, len);
								if (!ret) { error = Error::Canceled; }
								return ret;
							})
					: static_cast<ContentReceiverWithProgress>(
							[&](const char *buf, size_t n, uint64_t /*off*/,
								uint64_t /*len*/) {
								if (res.body.size() + n > res.body.max_size()) {
									return false;
								}
								res.body.append(buf, n);
								return true;
							});

			auto progress = [&](uint64_t current, uint64_t total) {
				if (!req.progress_) { return true; }
				auto ret = req.progress_(current, total);
				if (!ret) { error = Error::Canceled; }
				return ret;
			};

			int dummy_status;
			if (!detail::read_content(strm, res, (std::numeric_limits<size_t>::max)(),
									  dummy_status, std::move(progress), std::move(out),
									  decompress_)) {
				if (error != Error::Canceled) { error = Error::Read; }
				return false;
			}
		}

		if (res.get_header_value("Connection") == "close" ||
			(res.version == "HTTP/1.0" && res.reason != "Connection established")) {
			// TODO this requires a not-entirely-obvious chain of calls to be correct
			// for this to be safe. Maybe a code refactor (such as moving this out to
			// the send function and getting rid of the recursiveness of the mutex)
			// could make this more obvious.

			// This is safe to call because process_request is only called by
			// handle_request which is only called by send, which locks the request
			// mutex during the process. It would be a bug to call it from a different
			// thread since it's a thread-safety issue to do these things to the socket
			// if another thread is using the socket.
			lock_socket_and_shutdown_and_close();
		}

		// Log
		if (logger_) { logger_(req, res); }

		return true;
	}